

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  byte bVar2;
  pointer __nptr;
  uint uVar3;
  int *piVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  char cVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  char c;
  string st;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matching;
  char local_a9;
  void *local_a8;
  int local_a0;
  uint local_9c;
  vector<char,_std::allocator<char>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  int local_5c;
  timespec local_58;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_9c = 0;
  std::ios_base::sync_with_stdio(false);
  if (argc < 2) {
LAB_00102423:
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (char *)0x0;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (char *)0x0;
    std::vector<char,_std::allocator<char>_>::reserve(&local_98,0x400);
    while( true ) {
      while( true ) {
        uVar3 = getchar();
        local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = SUB41(uVar3,0);
        if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start._0_1_ != (allocator)0x7e) break;
        if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
        }
      }
      if ((uVar3 & 0xff) == 0xff) break;
      if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char *)&local_78);
      }
      else {
        *local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish = (char)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_;
        local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    uVar14 = (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
    local_a8 = operator_new(40000);
    memset(local_a8,0,40000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_78,uVar14 & 0xffffffff,(allocator_type *)&local_58);
    iVar12 = 0;
    if ((int)uVar14 != 0) {
      uVar8 = uVar14 & 0xffffffff;
      bVar17 = true;
      uVar10 = 0;
      do {
        if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar10] != ']') {
          uVar11 = uVar10;
          iVar12 = (int)uVar14;
          if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10] == '[') {
            if (uVar10 + 1 < uVar8) {
              iVar12 = 1;
              do {
                if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11 + 1] == ']') {
                  iVar12 = iVar12 + -1;
                }
                else if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11 + 1] == '[') {
                  iVar12 = iVar12 + 1;
                }
                uVar1 = uVar11 + 2;
                uVar11 = uVar11 + 1;
              } while ((uVar1 < uVar8) && (iVar12 != 0));
              if (iVar12 == 0) {
                *(int *)(CONCAT71(local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                  local_78.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar10 * 4) =
                     (int)uVar11;
                uVar11 = uVar11 & 0xffffffff;
                iVar12 = (int)uVar10;
                goto LAB_00102552;
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Mismatching parens.",0x13);
            iVar12 = 1;
            iVar15 = 1;
            if (bVar17) goto LAB_001028b1;
            break;
          }
LAB_00102552:
          *(int *)(CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_) + uVar11 * 4) = iVar12;
        }
        uVar10 = uVar10 + 1;
        bVar17 = uVar10 < uVar8;
        iVar12 = 0;
      } while (uVar10 != uVar8);
    }
    local_40 = (ulong)local_9c / 1000;
    local_48 = ((ulong)local_9c % 1000) * 1000000;
    iVar9 = 0;
    uVar3 = 0;
    local_a0 = 0;
    local_5c = iVar12;
    local_38 = uVar14;
    while (iVar15 = local_5c, uVar3 < (uint)local_38) {
      if (0 < (int)local_9c) {
        local_58.tv_sec = local_40;
        local_58.tv_nsec = local_48;
        do {
          iVar12 = nanosleep(&local_58,&local_58);
          if (iVar12 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
      lVar5 = (long)(int)uVar3;
      local_58.tv_sec =
           CONCAT71(local_58.tv_sec._1_7_,
                    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar5]);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_58,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      lVar16 = (long)iVar9;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(int *)((long)local_a8 + lVar16 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      uVar3 = uVar3 + 1;
      bVar2 = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5];
      if (bVar2 < 0x3c) {
        switch(bVar2) {
        case 0x2b:
          piVar4 = (int *)((long)local_a8 + lVar16 * 4);
          *piVar4 = *piVar4 + 1;
          break;
        case 0x2c:
          std::operator>>((istream *)&std::cin,&local_a9);
          *(int *)((long)local_a8 + lVar16 * 4) = (int)local_a9;
          break;
        case 0x2d:
          piVar4 = (int *)((long)local_a8 + lVar16 * 4);
          *piVar4 = *piVar4 + -1;
          break;
        case 0x2e:
          cVar13 = (char)*(undefined4 *)((long)local_a8 + lVar16 * 4);
          if (cVar13 < '\0') {
            cVar13 = '*';
          }
          local_58.tv_sec._0_1_ = cVar13;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,(char *)&local_58,1);
          std::ostream::flush();
          local_58.tv_sec = CONCAT71(local_58.tv_sec._1_7_,cVar13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_58,1);
        }
      }
      else if (bVar2 < 0x5b) {
        if (bVar2 == 0x3c) {
          bVar17 = iVar9 < 1;
          iVar9 = iVar9 + -1;
          if (bVar17) {
            iVar9 = 9999;
          }
        }
        else if ((bVar2 == 0x3e) && (bVar17 = 0x270e < iVar9, iVar9 = iVar9 + 1, bVar17)) {
          iVar9 = 0;
        }
      }
      else if (bVar2 == 0x5b) {
        if (*(int *)((long)local_a8 + lVar16 * 4) == 0) {
          iVar12 = *(int *)(CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + lVar5 * 4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
          uVar3 = iVar12 + 1;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+ ",2);
          local_a0 = local_a0 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cout,local_a0);
      }
      else if (bVar2 == 0x5d) {
        uVar3 = *(uint *)(CONCAT71(local_78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_78.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_1_) + lVar5 * 4);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_a0 = local_a0 + -1;
        std::ostream::operator<<((ostream *)&std::cout,local_a0);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
LAB_001028b1:
    if ((void *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_78.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_78.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_));
    }
    operator_delete(local_a8);
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return iVar15;
  }
  std::__cxx11::string::string((string *)&local_98,argv[1],(allocator *)&local_78);
  __nptr = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = __errno_location();
  iVar12 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol(__nptr,(char **)&local_78,10);
  if ((char *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar3 = (uint)lVar5;
    if (((int)uVar3 == lVar5) && (*piVar4 != 0x22)) {
      if (*piVar4 == 0) {
        *piVar4 = iVar12;
      }
      local_9c = 0;
      if (0 < (int)uVar3) {
        local_9c = uVar3;
      }
      if ((pointer *)
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          &local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage) {
        operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_00102423;
    }
  }
  uVar7 = std::__throw_out_of_range("stoi");
  if ((void *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  operator_delete(local_a8);
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

int main(int argc, char** argv) {
  cout.sync_with_stdio(false);

  int delay_ms = 0;
  if (argc > 1) {
    char* dn = argv[1];
    string st(dn);
    try {
      delay_ms = stoi(st);
    } catch (std::invalid_argument) {
      cerr << "Invalid duration." << endl;
      return 1;
    }
    if (delay_ms < 0) delay_ms = 0;
  }

  vector<char> code;
  {
    code.reserve(1024);
    char ch;
    while ((ch = getchar()) != END) {
      if (ch == BACK) {
        if (code.size()) code.pop_back();
      } else
        code.push_back(ch);
    }
  }
  const unsigned int m = code.size();

  vector<int> mem(N);
  int iMem = 0;

  vector<unsigned int> matching(m);
  for (unsigned int i = 0; i < m; i++) {
    switch (code[i]) {
      case '[':
        {
          unsigned int level = 1;
          unsigned int j = i + 1;
          for (; j < m && level > 0; j++) {
            switch (code[j]) {
              case '[': level++; break;
              case ']': level--; break;
              default: break;
            }
          }

          if (level > 0) {
            cerr << "Mismatching parens.";
            return 1;
          }

          j--;

          //cout << i << "::" << j << "- " << endl;
          matching[i] = j;
          matching[j] = i;
        }
        break;
      case ']':
        break;
      default:
        matching[i] = m;
        break;
    }
  }

#if 0
  for (int i = 0; i < m; i++) {
    cout << "[" << i << "] = " << code[i] << " ";
    if (matching[i] == m)
      cout << endl;
    else
      cout << matching[i] << endl;
  }
#endif

  int pc = 0;
  int level = 0;
  while (pc < m) {
    std::this_thread::sleep_for(std::chrono::milliseconds(delay_ms));
    int pc1 = pc + 1;
    cout << code[pc] << " " << pc << " " << iMem << " " << mem[iMem] << " ";
    switch (code[pc]) {
      case '+':
        mem[iMem]++;
        break;
      case '-':
        mem[iMem]--;
        break;
      case '<':
        iMem--;
        if (iMem < 0) iMem = N-1;
        break;
      case '>':
        iMem++;
        if (iMem >= N) iMem = 0;
        break;
      case '[':
        if (mem[iMem] == 0) {
          pc1 = matching[pc] + 1;
          cout << "- ";
        } else {
          cout << "+ ";
          level++;
        }
        cout << level;
        break;
      case ']':
        pc1 = matching[pc];
        cout << pc1 << " ";
        level--;
        cout << level;
        break;
      case '.':
        {
          char cho = !(((char)mem[iMem]) & (char)0x80) ? (char)mem[iMem] : '*';
          cerr << cho;
          cerr.flush();
          cout << cho;
        }
        break;
      case ',':
        char c; cin >> c;
        mem[iMem] = c;
        break;
      default: break;
    }
    cout << endl;
    pc = pc1;
  }
}